

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

unsigned_long_long
cfgfile::format_t<unsigned_long_long,_cfgfile::wstring_trait_t>::from_string
          (parser_info_t<cfgfile::wstring_trait_t> *info,string_t *value)

{
  long lVar1;
  long lVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__lhs;
  parser_info_t<cfgfile::wstring_trait_t> *in_RDI;
  exception *anon_var_0;
  unsigned_long_long result;
  size_t pos;
  size_t *in_stack_fffffffffffffb68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffb70;
  string_t *in_stack_fffffffffffffb78;
  exception_t<cfgfile::wstring_trait_t> *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb98;
  string *str;
  allocator<char> *in_stack_fffffffffffffba0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_1c1 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_179 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_131 [8];
  unsigned_long_long local_20;
  long local_18;
  parser_info_t<cfgfile::wstring_trait_t> *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  local_20 = std::__cxx11::stoull(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,0);
  lVar1 = local_18;
  lVar2 = std::__cxx11::wstring::length();
  if (lVar1 != lVar2) {
    __lhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
            __cxa_allocate_exception(0x30);
    this = local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,in_stack_fffffffffffffba0)
    ;
    wstring_trait_t::from_ascii(in_stack_fffffffffffffb98);
    std::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    __rhs = local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,(allocator<char> *)__rhs);
    wstring_trait_t::from_ascii(in_stack_fffffffffffffb98);
    std::operator+(__lhs,__rhs);
    parser_info_t<cfgfile::wstring_trait_t>::file_name_abi_cxx11_(local_8);
    std::operator+(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    str = local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,(allocator<char> *)__rhs);
    wstring_trait_t::from_ascii(str);
    std::operator+(__lhs,__rhs);
    parser_info_t<cfgfile::wstring_trait_t>::line_number(local_8);
    wstring_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffb68);
    std::operator+(__lhs,__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__lhs,(allocator<char> *)__rhs);
    wstring_trait_t::from_ascii(str);
    std::operator+(__lhs,__rhs);
    exception_t<cfgfile::wstring_trait_t>::exception_t
              (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    __cxa_throw(__lhs,&exception_t<cfgfile::wstring_trait_t>::typeinfo,
                exception_t<cfgfile::wstring_trait_t>::~exception_t);
  }
  return local_20;
}

Assistant:

static unsigned long long from_string( const parser_info_t< wstring_trait_t > & info,
		const wstring_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			unsigned long long result = std::stoull( value, &pos );

			if( pos != value.length() )
				throw exception_t< wstring_trait_t >(
					wstring_trait_t::from_ascii( "Invalid value: \"" ) +
					value + wstring_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					wstring_trait_t::from_ascii( "\" on line " ) +
					wstring_trait_t::to_string( info.line_number() ) +
					wstring_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< wstring_trait_t >(
				wstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + wstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				wstring_trait_t::from_ascii( "\" on line " ) +
				wstring_trait_t::to_string( info.line_number() ) +
				wstring_trait_t::from_ascii( "." ) );
		}
	}